

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::i8255PortHandler::
set_activity_observer(i8255PortHandler *this,Observer *observer)

{
  Observer *pOVar1;
  bool bVar2;
  long *local_38 [2];
  long local_28 [2];
  
  this->activity_observer_ = observer;
  if (observer != (Observer *)0x0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Tape motor","");
    (*observer->_vptr_Observer[2])(observer,local_38,0);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    pOVar1 = this->activity_observer_;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Tape motor","");
    bVar2 = Storage::Tape::BinaryTapePlayer::get_motor_control(this->tape_player_);
    (*pOVar1->_vptr_Observer[4])(pOVar1,local_38,(ulong)bVar2);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void set_activity_observer(Activity::Observer *observer) {
					activity_observer_ = observer;
					if(activity_observer_) {
						activity_observer_->register_led("Tape motor");
						activity_observer_->set_led_status("Tape motor", tape_player_.get_motor_control());
					}
				}